

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execmd.c
# Opt level: O0

int exe_fuses_and_daemons
              (voccxdef *ctx,int err,int do_fuses,objnum actor,objnum verb,vocoldef *dobj_list,
              int dobj_cnt,objnum prep,objnum iobj)

{
  int in_EDX;
  int in_ESI;
  undefined8 *in_RDI;
  runcxdef *in_R9;
  errdef fr_;
  int err2;
  undefined4 in_stack_00000150;
  errdef *in_stack_fffffffffffffe98;
  errcxdef *in_stack_fffffffffffffea0;
  int cnt;
  int in_stack_fffffffffffffea8;
  undefined2 in_stack_fffffffffffffeac;
  objnum in_stack_fffffffffffffeae;
  voccxdef *in_stack_fffffffffffffeb0;
  __jmp_buf_tag _Stack_f0;
  int in_stack_ffffffffffffffd8;
  objnum objn;
  int local_c;
  
  objn = 0;
  local_c = in_ESI;
  if (in_EDX != 0) {
    objn = 0;
    in_stack_fffffffffffffea8 = _setjmp(&_Stack_f0);
    if (in_stack_fffffffffffffea8 == 0) {
      in_stack_fffffffffffffea0 = *(errcxdef **)*in_RDI;
      *(undefined1 **)*in_RDI = &stack0xfffffffffffffea0;
      exedaem((voccxdef *)CONCAT26(actor,CONCAT24(verb,in_stack_00000150)));
      exefuse(ctx,err);
      *(errcxdef **)*in_RDI = in_stack_fffffffffffffea0;
    }
    else {
      *(errcxdef **)*in_RDI = in_stack_fffffffffffffea0;
      if (in_stack_fffffffffffffea8 != 0x3f6) {
        errrse1(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      }
      objn = 0;
      local_c = 0x3f6;
    }
  }
  cnt = (int)((ulong)in_stack_fffffffffffffea0 >> 0x20);
  if (*(short *)((long)in_RDI + 0x110c) != -1) {
    runpnum((runcxdef *)in_stack_fffffffffffffeb0,
            CONCAT26(in_stack_fffffffffffffeae,
                     CONCAT24(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8)));
    runpobj((runcxdef *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffeae);
    runpobj((runcxdef *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffeae);
    voc_push_vocoldef_list
              (in_stack_fffffffffffffeb0,
               (vocoldef *)
               CONCAT26(in_stack_fffffffffffffeae,
                        CONCAT24(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8)),cnt);
    runpobj((runcxdef *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffeae);
    runpobj((runcxdef *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffeae);
    runfn(in_R9,objn,in_stack_ffffffffffffffd8);
  }
  return local_c;
}

Assistant:

int exe_fuses_and_daemons(voccxdef *ctx, int err, int do_fuses,
                          objnum actor, objnum verb,
                          vocoldef *dobj_list, int dobj_cnt,
                          objnum prep, objnum iobj)
{
    int err2;

    /* presume no error */
    err2 = 0;
    
    /* execute fuses and daemons if desired - trap any errors that occur */
    if (do_fuses)
    {
        ERRBEGIN(ctx->voccxerr)
        {
            /* execute daemons */
            exedaem(ctx);
            
            /* execute fuses */
            (void)exefuse(ctx, TRUE);
        }
        ERRCATCH(ctx->voccxerr, err2)
        {
            /* 
             *   if 'abort' was invoked, ignore it, since it's now had the
             *   desired effect of skipping any remaining fuses and
             *   daemons; resignal any other error 
             */
            if (err2 != ERR_RUNABRT)
                errrse(ctx->voccxerr);
            
            /* replace any previous error with the new error code */
            err = err2;
        }
        ERREND(ctx->voccxerr);
    }

    /* execute endCommand if it's defined */
    if (ctx->voccxendcmd != MCMONINV)
    {
        /* push the arguments */
        runpnum(ctx->voccxrun, err);
        runpobj(ctx->voccxrun, iobj);
        runpobj(ctx->voccxrun, prep);
        voc_push_vocoldef_list(ctx, dobj_list, dobj_cnt);
        runpobj(ctx->voccxrun, verb);
        runpobj(ctx->voccxrun, actor);

        /* call endCommand */
        runfn(ctx->voccxrun, ctx->voccxendcmd, 6);
    }

    /* return the error status */
    return err;
}